

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Scl_LibertyParseDumpItem(FILE *pFile,Scl_Tree_t *p,Scl_Item_t *pItem,int nOffset)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  size_t sVar3;
  char *__ptr;
  
  while( true ) {
    iVar1 = pItem->Type;
    if (iVar1 == 3) {
      Scl_PrintSpace(pFile,nOffset);
      Scl_PrintWord(pFile,p,pItem->Key);
      fputc(0x28,(FILE *)pFile);
      Scl_PrintWord(pFile,p,pItem->Head);
      __ptr = ");\n";
      sVar3 = 3;
    }
    else {
      sVar3 = 2;
      if (iVar1 == 2) {
        Scl_PrintSpace(pFile,nOffset);
        Scl_PrintWord(pFile,p,pItem->Key);
        fwrite(" : ",3,1,(FILE *)pFile);
        Scl_PrintWord(pFile,p,pItem->Head);
        __ptr = ";\n";
      }
      else {
        if (iVar1 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLiberty.c"
                        ,0x84,
                        "void Scl_LibertyParseDumpItem(FILE *, Scl_Tree_t *, Scl_Item_t *, int)");
        }
        Scl_PrintSpace(pFile,nOffset);
        Scl_PrintWord(pFile,p,pItem->Key);
        fputc(0x28,(FILE *)pFile);
        Scl_PrintWord(pFile,p,pItem->Head);
        fwrite(") {\n",4,1,(FILE *)pFile);
        pSVar2 = Scl_LibertyItem(p,pItem->Child);
        if (pSVar2 != (Scl_Item_t *)0x0) {
          pSVar2 = Scl_LibertyItem(p,pItem->Child);
          Scl_LibertyParseDumpItem(pFile,p,pSVar2,nOffset + 2);
        }
        Scl_PrintSpace(pFile,nOffset);
        __ptr = "}\n";
      }
    }
    fwrite(__ptr,sVar3,1,(FILE *)pFile);
    pSVar2 = Scl_LibertyItem(p,pItem->Next);
    if (pSVar2 == (Scl_Item_t *)0x0) break;
    pItem = Scl_LibertyItem(p,pItem->Next);
  }
  return;
}

Assistant:

void Scl_LibertyParseDumpItem( FILE * pFile, Scl_Tree_t * p, Scl_Item_t * pItem, int nOffset )
{
    if ( pItem->Type == SCL_LIBERTY_PROC )
    {
        Scl_PrintSpace( pFile, nOffset );
        Scl_PrintWord( pFile, p, pItem->Key );
        fprintf( pFile, "(" );
        Scl_PrintWord( pFile, p, pItem->Head );
        fprintf( pFile, ") {\n" );
        if ( Scl_LibertyItem(p, pItem->Child) )
            Scl_LibertyParseDumpItem( pFile, p, Scl_LibertyItem(p, pItem->Child), nOffset + 2 );
        Scl_PrintSpace( pFile, nOffset );
        fprintf( pFile, "}\n" );
    }
    else if ( pItem->Type == SCL_LIBERTY_EQUA )
    {
        Scl_PrintSpace( pFile, nOffset );
        Scl_PrintWord( pFile, p, pItem->Key );
        fprintf( pFile, " : " );
        Scl_PrintWord( pFile, p, pItem->Head );
        fprintf( pFile, ";\n" );
    }
    else if ( pItem->Type == SCL_LIBERTY_LIST )
    {
        Scl_PrintSpace( pFile, nOffset );
        Scl_PrintWord( pFile, p, pItem->Key );
        fprintf( pFile, "(" );
        Scl_PrintWord( pFile, p, pItem->Head );
        fprintf( pFile, ");\n" );
    }
    else assert( 0 );
    if ( Scl_LibertyItem(p, pItem->Next) )
        Scl_LibertyParseDumpItem( pFile, p, Scl_LibertyItem(p, pItem->Next), nOffset );
}